

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_parser.c
# Opt level: O0

MPP_RET mpp_mpg4_parser_split(Mpg4dParser ctx,MppPacket dst,MppPacket src)

{
  uint uVar1;
  RK_U32 RVar2;
  void *pvVar3;
  size_t sVar4;
  RK_S64 v;
  undefined1 *puVar5;
  uint uVar6;
  uint uVar7;
  uint local_58;
  uint local_54;
  RK_U32 src_pos;
  RK_U32 dst_len;
  RK_U8 *dst_buf;
  RK_S64 src_pts;
  RK_U32 src_eos;
  RK_U32 src_len;
  RK_U8 *src_buf;
  Mpg4dParserImpl *p;
  MPP_RET ret;
  MppPacket src_local;
  MppPacket dst_local;
  Mpg4dParser ctx_local;
  
  p._4_4_ = MPP_NOK;
  pvVar3 = mpp_packet_get_pos(src);
  sVar4 = mpp_packet_get_length(src);
  uVar1 = (uint)sVar4;
  RVar2 = mpp_packet_get_eos(src);
  v = mpp_packet_get_pts(src);
  puVar5 = (undefined1 *)mpp_packet_get_data(dst);
  sVar4 = mpp_packet_get_length(dst);
  local_54 = (uint)sVar4;
  local_58 = 0;
  if ((mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","in\n","mpp_mpg4_parser_split");
  }
  if (*(int *)((long)ctx + 0x30) == 0) {
    if ((local_54 < 4) && ((*(uint *)((long)ctx + 0x2c) & 0xffffff) == 1)) {
      *puVar5 = 0;
      puVar5[1] = 0;
      puVar5[2] = 1;
      local_54 = 3;
    }
    do {
      if (uVar1 <= local_58) goto LAB_001f105a;
      *(uint *)((long)ctx + 0x2c) =
           *(int *)((long)ctx + 0x2c) << 8 | (uint)*(byte *)((long)pvVar3 + (ulong)local_58);
      uVar6 = local_58 + 1;
      uVar7 = local_54 + 1;
      puVar5[local_54] = *(undefined1 *)((long)pvVar3 + (ulong)local_58);
      local_58 = uVar6;
      local_54 = uVar7;
    } while (*(int *)((long)ctx + 0x2c) != 0x1b6);
    *(undefined4 *)((long)ctx + 0x30) = 1;
    mpp_packet_set_pts(dst,v);
  }
LAB_001f105a:
  uVar6 = local_54;
  if (*(int *)((long)ctx + 0x30) != 0) {
    do {
      local_54 = uVar6;
      if (uVar1 <= local_58) goto LAB_001f10ea;
      *(uint *)((long)ctx + 0x2c) =
           *(int *)((long)ctx + 0x2c) << 8 | (uint)*(byte *)((long)pvVar3 + (ulong)local_58);
      uVar6 = local_58 + 1;
      puVar5[local_54] = *(undefined1 *)((long)pvVar3 + (ulong)local_58);
      local_58 = uVar6;
      uVar6 = local_54 + 1;
    } while ((*(uint *)((long)ctx + 0x2c) & 0xffffff) != 1);
    local_54 = local_54 - 2;
    *(undefined4 *)((long)ctx + 0x30) = 0;
    p._4_4_ = MPP_OK;
  }
LAB_001f10ea:
  if ((RVar2 != 0) && (uVar1 <= local_58)) {
    mpp_packet_set_eos(dst);
    p._4_4_ = MPP_OK;
  }
  mpp_packet_set_length(dst,(ulong)local_54);
  mpp_packet_set_pos(src,(void *)((long)pvVar3 + (ulong)local_58));
  if ((mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","out\n","mpp_mpg4_parser_split");
  }
  return p._4_4_;
}

Assistant:

MPP_RET mpp_mpg4_parser_split(Mpg4dParser ctx, MppPacket dst, MppPacket src)
{
    MPP_RET ret = MPP_NOK;
    Mpg4dParserImpl *p = (Mpg4dParserImpl *)ctx;
    RK_U8 *src_buf = (RK_U8 *)mpp_packet_get_pos(src);
    RK_U32 src_len = (RK_U32)mpp_packet_get_length(src);
    RK_U32 src_eos = mpp_packet_get_eos(src);
    RK_S64 src_pts = mpp_packet_get_pts(src);
    RK_U8 *dst_buf = (RK_U8 *)mpp_packet_get_data(dst);
    RK_U32 dst_len = (RK_U32)mpp_packet_get_length(dst);
    RK_U32 src_pos = 0;

    mpg4d_dbg_func("in\n");

    // find the began of the vop
    if (!p->vop_header_found) {
        // add last startcode to the new frame data
        if ((dst_len < sizeof(p->state))
            && ((p->state & 0x00FFFFFF) == 0x000001)) {
            dst_buf[0] = 0;
            dst_buf[1] = 0;
            dst_buf[2] = 1;
            dst_len = 3;
        }
        while (src_pos < src_len) {
            p->state = (p->state << 8) | src_buf[src_pos];
            dst_buf[dst_len++] = src_buf[src_pos++];
            if (p->state == MPG4_VOP_STARTCODE) {
                p->vop_header_found = 1;
                mpp_packet_set_pts(dst, src_pts);
                break;
            }
        }
    }
    // find the end of the vop
    if (p->vop_header_found) {
        while (src_pos < src_len) {
            p->state = (p->state << 8) | src_buf[src_pos];
            dst_buf[dst_len++] = src_buf[src_pos++];
            if ((p->state & 0x00FFFFFF) == 0x000001) {
                dst_len -= 3;
                p->vop_header_found = 0;
                ret = MPP_OK; // split complete
                break;
            }
        }
    }
    // the last packet
    if (src_eos && src_pos >= src_len) {
        mpp_packet_set_eos(dst);
        ret = MPP_OK;
    }
    // reset the src and dst
    mpp_packet_set_length(dst, dst_len);
    mpp_packet_set_pos(src, src_buf + src_pos);

    mpg4d_dbg_func("out\n");

    return ret;
}